

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O0

void av1_cdef_init_fb_row
               (AV1_COMMON *cm,MACROBLOCKD *xd,CdefBlockInfo *fb_info,uint16_t **linebuf,
               uint16_t *src,AV1CdefSyncData *cdef_sync,int fbr)

{
  int iVar1;
  int iVar2;
  int vsize;
  int dstride;
  int iVar3;
  int iVar4;
  uint16_t *dst;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  AV1_COMMON *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  uint in_stack_00000008;
  uint16_t *top_linebuf;
  int stride;
  int offset;
  int mi_high_l2;
  int plane;
  _Bool ping_pong;
  int luma_stride;
  int nvfb;
  int num_planes;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff9c;
  int local_44;
  undefined4 in_stack_ffffffffffffffc0;
  int sstride;
  
  iVar2 = av1_num_planes(in_RDI);
  vsize = ((in_RDI->mi_params).mi_rows + 0xf) / 0x10;
  iVar1 = (in_RDI->mi_params).mi_cols;
  sstride = CONCAT13((in_stack_00000008 & 1) != 0,(int3)in_stack_ffffffffffffffc0);
  *(uint *)(in_RDX + 0x4a) = (uint)((in_stack_00000008 & 0xfffffff) == 0);
  if (in_stack_00000008 == vsize - 1U) {
    *(undefined4 *)(in_RDX + 0x4b) = 1;
  }
  else {
    *(uint *)(in_RDX + 0x4b) = (uint)((in_stack_00000008 + 1) * 0x10 == (in_RDI->mi_params).mi_rows)
    ;
  }
  *in_RDX = in_R8;
  *(int *)(in_RDX + 0x4c) = (in_RDI->cdef_info).cdef_damping;
  if (in_RDI->seq_params->bit_depth == AOM_BITS_8) {
    dstride = 0;
  }
  else {
    dstride = in_RDI->seq_params->bit_depth - AOM_BITS_8;
  }
  *(int *)((long)in_RDX + 0x264) = dstride;
  memset((void *)((long)in_RDX + 0x274),0,0x400);
  memset((void *)((long)in_RDX + 0x674),0,0x400);
  for (local_44 = 0; local_44 < iVar2; local_44 = local_44 + 1) {
    iVar3 = (in_stack_00000008 + 1) * 0x10 <<
            (2U - (char)*(undefined4 *)(in_RSI + (long)local_44 * 0xa30 + 0x18) & 0x1f);
    iVar4 = (int)(iVar1 * 4 + 0xfU & 0xfffffff0) >>
            ((byte)*(undefined4 *)(in_RSI + (long)local_44 * 0xa30 + 0x14) & 0x1f);
    dst = (uint16_t *)
          (*(long *)(in_RCX + (long)local_44 * 8) +
          (long)(int)((uint)((byte)((uint)sstride >> 0x18) & 1) * 2 * iVar4) * 2);
    in_RDX[(long)local_44 + 4] = *(long *)(in_RCX + (long)local_44 * 8) + (long)(iVar4 << 2) * 2;
    if (in_stack_00000008 != vsize - 1U) {
      av1_cdef_copy_sb8_16
                ((AV1_COMMON *)CONCAT44(iVar3,iVar4),dst,dstride,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffffff9c,iVar4),in_stack_ffffffffffffff94,2,
                 sstride,vsize,(int)in_R9);
    }
    in_RDX[(long)local_44 + 1] =
         *(long *)(in_RCX + (long)local_44 * 8) +
         (long)(int)((uint)(((byte)((uint)sstride >> 0x18) ^ 0xff) & 1) * 2 * iVar4) * 2;
    if (in_stack_00000008 != vsize - 1U) {
      av1_cdef_copy_sb8_16
                ((AV1_COMMON *)CONCAT44(iVar3,iVar4),dst,dstride,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffffff9c,iVar4),in_stack_ffffffffffffff94,2,
                 sstride,vsize,(int)in_R9);
    }
  }
  return;
}

Assistant:

void av1_cdef_init_fb_row(const AV1_COMMON *const cm,
                          const MACROBLOCKD *const xd,
                          CdefBlockInfo *const fb_info,
                          uint16_t **const linebuf, uint16_t *const src,
                          struct AV1CdefSyncData *const cdef_sync, int fbr) {
  (void)cdef_sync;
  const int num_planes = av1_num_planes(cm);
  const int nvfb = (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  const int luma_stride =
      ALIGN_POWER_OF_TWO(cm->mi_params.mi_cols << MI_SIZE_LOG2, 4);
  const bool ping_pong = fbr & 1;
  // for the current filter block, it's top left corner mi structure (mi_tl)
  // is first accessed to check whether the top and left boundaries are
  // frame boundaries. Then bottom-left and top-right mi structures are
  // accessed to check whether the bottom and right boundaries
  // (respectively) are frame boundaries.
  //
  // Note that we can't just check the bottom-right mi structure - eg. if
  // we're at the right-hand edge of the frame but not the bottom, then
  // the bottom-right mi is NULL but the bottom-left is not.
  fb_info->frame_boundary[TOP] = (MI_SIZE_64X64 * fbr == 0) ? 1 : 0;
  if (fbr != nvfb - 1)
    fb_info->frame_boundary[BOTTOM] =
        (MI_SIZE_64X64 * (fbr + 1) == cm->mi_params.mi_rows) ? 1 : 0;
  else
    fb_info->frame_boundary[BOTTOM] = 1;

  fb_info->src = src;
  fb_info->damping = cm->cdef_info.cdef_damping;
  fb_info->coeff_shift = AOMMAX(cm->seq_params->bit_depth - 8, 0);
  av1_zero(fb_info->dir);
  av1_zero(fb_info->var);

  for (int plane = 0; plane < num_planes; plane++) {
    const int mi_high_l2 = MI_SIZE_LOG2 - xd->plane[plane].subsampling_y;
    const int offset = MI_SIZE_64X64 * (fbr + 1) << mi_high_l2;
    const int stride = luma_stride >> xd->plane[plane].subsampling_x;
    // here ping-pong buffers are maintained for top linebuf
    // to avoid linebuf over-write by consecutive row.
    uint16_t *const top_linebuf =
        &linebuf[plane][ping_pong * CDEF_VBORDER * stride];
    fb_info->bot_linebuf[plane] = &linebuf[plane][(CDEF_VBORDER << 1) * stride];

    if (fbr != nvfb - 1)  // top line buffer copy
      av1_cdef_copy_sb8_16(cm, top_linebuf, stride, xd->plane[plane].dst.buf,
                           offset - CDEF_VBORDER, 0,
                           xd->plane[plane].dst.stride, CDEF_VBORDER, stride);
    fb_info->top_linebuf[plane] =
        &linebuf[plane][(!ping_pong) * CDEF_VBORDER * stride];

    if (fbr != nvfb - 1)  // bottom line buffer copy
      av1_cdef_copy_sb8_16(cm, fb_info->bot_linebuf[plane], stride,
                           xd->plane[plane].dst.buf, offset, 0,
                           xd->plane[plane].dst.stride, CDEF_VBORDER, stride);
  }
}